

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MultiCutFab.cpp
# Opt level: O3

bool __thiscall amrex::MultiCutFab::ok(MultiCutFab *this,int global_box_index)

{
  FabArray<amrex::EBCellFlagFab> *this_00;
  int iVar1;
  
  this_00 = this->m_cellflags;
  iVar1 = FabArrayBase::localindex(&this_00->super_FabArrayBase,global_box_index);
  return *(int *)&((this_00->m_fabs_v).
                   super__Vector_base<amrex::EBCellFlagFab_*,_std::allocator<amrex::EBCellFlagFab_*>_>
                   ._M_impl.super__Vector_impl_data._M_start[iVar1]->
                  super_BaseFab<amrex::EBCellFlag>).field_0x44 == 1;
}

Assistant:

bool
MultiCutFab::ok (int global_box_index) const noexcept
{
    return (*m_cellflags)[global_box_index].getType() == FabType::singlevalued;
}